

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::push
          (op_queue<asio::detail::reactor_op> *this,reactor_op *h)

{
  reactor_op *in_RSI;
  undefined8 *in_RDI;
  reactor_op *local_10 [2];
  
  local_10[0] = in_RSI;
  op_queue_access::next<asio::detail::reactor_op,asio::detail::reactor_op>
            (local_10,(reactor_op *)0x0);
  if (in_RDI[1] == 0) {
    in_RDI[1] = local_10[0];
    *in_RDI = local_10[0];
  }
  else {
    op_queue_access::next<asio::detail::reactor_op,asio::detail::reactor_op>
              ((reactor_op **)(in_RDI + 1),local_10[0]);
    in_RDI[1] = local_10[0];
  }
  return;
}

Assistant:

void push(Operation* h)
  {
    op_queue_access::next(h, static_cast<Operation*>(0));
    if (back_)
    {
      op_queue_access::next(back_, h);
      back_ = h;
    }
    else
    {
      front_ = back_ = h;
    }
  }